

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,TextureCubeArrayView *src,float *texCoord,ReferenceParams *params
               )

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  byte bVar10;
  bool bVar11;
  ulong uVar12;
  int i;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int faceSize;
  int iVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  TextureCubeArrayView TVar30;
  Vec3 coord;
  Vector<float,_4> res_1;
  Vec3 triW [2];
  Vec3 triQ [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec3 coordDy;
  Vec3 coordDx;
  TextureCubeArrayView src_1;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vector<float,_4> res;
  float local_178;
  Vec3 local_16c;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  uint uStack_144;
  undefined8 uStack_140;
  float local_138 [8];
  float local_118 [8];
  float local_f8 [8];
  float local_d8 [8];
  float local_b8 [6];
  Vec3 local_a0;
  Vec3 local_94;
  undefined1 local_88 [16];
  TextureCubeArrayView local_78;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_68;
  float local_48 [6];
  
  fVar22 = *texCoord;
  fVar23 = texCoord[1];
  fVar28 = texCoord[4];
  fVar27 = texCoord[8];
  fVar29 = texCoord[0xc];
  fVar1 = texCoord[5];
  fVar2 = texCoord[9];
  fVar25 = texCoord[0xd];
  fVar3 = texCoord[2];
  fVar4 = texCoord[6];
  fVar5 = texCoord[10];
  fVar6 = texCoord[0xe];
  fVar7 = texCoord[3];
  fVar8 = texCoord[7];
  fVar9 = texCoord[0xb];
  fVar24 = texCoord[0xf];
  local_68.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar30 = tcu::getEffectiveTextureView(src,&local_68,&params->sampler);
  local_88._8_8_ = TVar30.m_levels;
  local_88._0_4_ = TVar30.m_numLevels;
  fVar21 = (float)dst->m_width;
  local_b8[0] = fVar22;
  local_b8[1] = fVar28;
  local_b8[2] = fVar27;
  local_b8[3] = fVar29;
  local_b8[4] = fVar27;
  local_b8[5] = fVar28;
  local_d8[0] = fVar23;
  local_d8[1] = fVar1;
  local_d8[2] = fVar2;
  local_d8[3] = fVar25;
  local_d8[4] = fVar2;
  local_d8[5] = fVar1;
  local_f8[0] = fVar3;
  local_f8[1] = fVar4;
  local_f8[2] = fVar5;
  local_f8[3] = fVar6;
  local_f8[4] = fVar5;
  local_f8[5] = fVar4;
  local_118[0] = fVar7;
  local_118[1] = fVar8;
  local_118[2] = fVar9;
  local_118[3] = fVar24;
  local_118[4] = fVar9;
  local_118[5] = fVar8;
  local_138[1] = (params->super_RenderParams).w.m_data[1];
  local_138[2] = (params->super_RenderParams).w.m_data[2];
  local_138[0] = (params->super_RenderParams).w.m_data[0];
  local_138[3] = (params->super_RenderParams).w.m_data[3];
  local_138[4] = local_138[2];
  local_138[5] = local_138[1];
  local_178 = 0.0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_178 = (params->super_RenderParams).bias;
  }
  if (0 < dst->m_height) {
    fVar22 = (float)dst->m_height;
    iVar19 = 0;
    do {
      if (0 < dst->m_width) {
        fVar23 = (float)iVar19 + 0.5;
        local_15c = fVar23 / fVar22;
        local_160 = 1.0 - local_15c;
        iVar18 = 0;
        do {
          fVar29 = (float)iVar18 + 0.5;
          fVar27 = fVar29 / fVar21;
          bVar11 = 1.0 <= local_15c + fVar27;
          fVar28 = local_15c;
          if (bVar11) {
            fVar27 = 1.0 - fVar27;
            fVar28 = local_160;
          }
          uVar12 = (ulong)bVar11;
          fVar1 = local_b8[uVar12 * 3];
          fVar2 = local_b8[uVar12 * 3 + 1];
          fVar25 = local_b8[uVar12 * 3 + 2];
          local_16c.m_data[0] = (fVar2 - fVar1) * fVar28 + (fVar25 - fVar1) * fVar27 + fVar1;
          fVar3 = local_d8[uVar12 * 3];
          local_154 = local_d8[uVar12 * 3 + 1];
          fVar4 = local_d8[uVar12 * 3 + 2];
          local_16c.m_data[1] = (local_154 - fVar3) * fVar28 + (fVar4 - fVar3) * fVar27 + fVar3;
          fVar5 = local_f8[uVar12 * 3];
          fVar6 = local_f8[uVar12 * 3 + 2];
          local_158 = local_f8[uVar12 * 3 + 1];
          local_16c.m_data[2] = (local_158 - fVar5) * fVar28 + (fVar6 - fVar5) * fVar27 + fVar5;
          fVar26 = fVar28 + -1.0;
          fVar7 = local_138[uVar12 * 3 + 1];
          fVar8 = local_138[uVar12 * 3 + 2];
          fVar9 = local_138[uVar12 * 3];
          fVar24 = fVar7 * fVar9 * fVar8;
          local_150 = (local_158 - fVar5) * fVar8;
          local_14c = fVar23 * fVar8;
          local_94.m_data[2] =
               (fVar21 * fVar26 + fVar29) * fVar7 * fVar8 -
               (fVar8 * fVar21 * fVar28 + fVar29 * fVar7) * fVar9;
          fVar29 = fVar24 * fVar21;
          local_94.m_data[2] = local_94.m_data[2] * local_94.m_data[2];
          local_94.m_data[0] =
               (((fVar1 - fVar25) * fVar7 * fVar26 +
                ((fVar2 - fVar1) * fVar8 + (fVar25 - fVar2) * fVar9) * fVar28) * fVar29) /
               local_94.m_data[2];
          local_94.m_data[1] =
               (((fVar3 - fVar4) * fVar7 * fVar26 +
                ((local_154 - fVar3) * fVar8 + (fVar4 - local_154) * fVar9) * fVar28) * fVar29) /
               local_94.m_data[2];
          local_94.m_data[2] =
               (((fVar5 - fVar6) * fVar7 * fVar26 +
                (local_150 + (fVar6 - local_158) * fVar9) * fVar28) * fVar29) / local_94.m_data[2];
          fVar29 = fVar27 + -1.0;
          local_a0.m_data[2] =
               (fVar22 * fVar29 + fVar23) * fVar7 * fVar8 -
               (fVar7 * fVar22 * fVar27 + local_14c) * fVar9;
          fVar24 = fVar24 * fVar22;
          local_a0.m_data[2] = local_a0.m_data[2] * local_a0.m_data[2];
          local_a0.m_data[0] =
               (((fVar1 - fVar2) * fVar8 * fVar29 +
                ((fVar2 - fVar25) * fVar9 + (fVar25 - fVar1) * fVar7) * fVar27) * fVar24) /
               local_a0.m_data[2];
          local_a0.m_data[1] =
               (((fVar3 - local_154) * fVar8 * fVar29 +
                ((local_154 - fVar4) * fVar9 + (fVar4 - fVar3) * fVar7) * fVar27) * fVar24) /
               local_a0.m_data[2];
          local_a0.m_data[2] =
               (((fVar5 - local_158) * fVar8 * fVar29 +
                ((local_158 - fVar6) * fVar9 + (fVar6 - fVar5) * fVar7) * fVar27) * fVar24) /
               local_a0.m_data[2];
          fVar29 = local_118[uVar12 * 3];
          fVar1 = local_118[uVar12 * 3 + 1];
          fVar2 = local_118[uVar12 * 3 + 2];
          if ((int)local_88._0_4_ < 1) {
            faceSize = 0;
          }
          else {
            faceSize = ((IVec3 *)(local_88._8_8_ + 8))->m_data[0];
          }
          fVar25 = computeCubeLodFromDerivates
                             (params->lodMode,&local_16c,&local_94,&local_a0,faceSize);
          fVar27 = (fVar1 - fVar29) * fVar28 + (fVar2 - fVar29) * fVar27 + fVar29;
          fVar25 = fVar25 + local_178;
          fVar28 = params->maxLod;
          if (fVar25 <= params->maxLod) {
            fVar28 = fVar25;
          }
          uVar20 = -(uint)(fVar25 < params->minLod);
          fVar28 = (float)(uVar20 & (uint)params->minLod | ~uVar20 & (uint)fVar28);
          if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
            local_78.m_numLevels =
                 (int)tcu::TextureCubeArrayView::sampleCompare
                                ((TextureCubeArrayView *)local_88,&params->sampler,
                                 (params->super_RenderParams).ref,local_16c.m_data[0],
                                 local_16c.m_data[1],local_16c.m_data[2],fVar27,fVar28);
            local_78._4_8_ = 0;
            local_78.m_levels._4_4_ = 0x3f800000;
          }
          else {
            tcu::TextureCubeArrayView::sample
                      (&local_78,(Sampler *)local_88,local_16c.m_data[0],local_16c.m_data[1],
                       local_16c.m_data[2],fVar27,fVar28);
          }
          local_48[0] = 0.0;
          local_48[1] = 0.0;
          local_48[2] = 0.0;
          local_48[3] = 0.0;
          lVar14 = 0;
          do {
            local_48[lVar14] =
                 (float)(&local_78.m_numLevels)[lVar14] *
                 (params->super_RenderParams).colorScale.m_data[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          _local_148 = 0;
          uStack_140 = 0;
          lVar14 = 0;
          do {
            (&local_148)[lVar14] =
                 local_48[lVar14] + (params->super_RenderParams).colorBias.m_data[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          bVar10 = dst->m_colorMask;
          uVar13 = 0;
          uVar20 = 0;
          if ((bVar10 & 1) != 0) {
            uVar15 = 0x7e - ((int)local_148 >> 0x17);
            uVar20 = (((uint)local_148 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                     0x800000;
            if (8 < uVar15) {
              uVar20 = uVar15;
            }
            uVar20 = uVar20 >> 0x18;
          }
          if ((bVar10 & 2) != 0) {
            uVar15 = 0x7e - ((int)uStack_144 >> 0x17);
            uVar13 = ((uStack_144 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                     0x800000;
            if (8 < uVar15) {
              uVar13 = uVar15;
            }
            uVar13 = uVar13 >> 0x10 & 0xff00;
          }
          uVar15 = 0;
          if ((bVar10 & 4) != 0) {
            uVar16 = 0x7e - ((int)(uint)uStack_140 >> 0x17);
            uVar15 = (((uint)uStack_140 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f)) +
                     0x800000;
            if (8 < uVar16) {
              uVar15 = uVar16;
            }
            uVar15 = uVar15 >> 8 & 0xff0000;
          }
          uVar16 = 0xff000000;
          if ((bVar10 & 8) != 0) {
            uVar17 = 0x7e - ((int)uStack_140._4_4_ >> 0x17);
            uVar16 = ((uStack_140._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar17 & 0x1f)) +
                     0x800000;
            if (8 < uVar17) {
              uVar16 = uVar17;
            }
            uVar16 = uVar16 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)((dst->m_y + iVar19) * dst->m_surface->m_width + dst->m_x + iVar18) * 4) =
               uVar13 | uVar20 | uVar15 | uVar16;
          iVar18 = iVar18 + 1;
        } while (iVar18 < dst->m_width);
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < dst->m_height);
  }
  if (local_68.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::TextureCubeArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[4+0], texCoord[8+0], texCoord[12+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[4+1], texCoord[8+1], texCoord[12+1]);
	tcu::Vec4 rq = tcu::Vec4(texCoord[0+2], texCoord[4+2], texCoord[8+2], texCoord[12+2]);
	tcu::Vec4 qq = tcu::Vec4(texCoord[0+3], texCoord[4+3], texCoord[8+3], texCoord[12+3]);

	sampleTextureCubeArray(dst, src, sq, tq, rq, qq, params);
}